

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidBranchOutputNotProduced2(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *this;
  Arena *pAVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *this_00;
  ArenaStringPtr *pAVar4;
  NeuralNetworkLayer *pNVar5;
  ActivationParams *pAVar6;
  NeuralNetwork *pNVar7;
  ostream *poVar8;
  undefined1 local_160 [8];
  Result res;
  BranchLayerParams *branch_layer;
  NeuralNetworkLayer *l4;
  NeuralNetworkLayer *l3;
  NeuralNetwork *nnMain;
  NeuralNetworkLayer *l1;
  NeuralNetwork nnIf;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  this = CoreML::Specification::ModelDescription::add_input(pMVar1);
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this->name_,"A",pAVar2);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(this);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(this);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nnIf._80_8_ = CoreML::Specification::ModelDescription::add_output(pMVar1);
  pAVar4 = &((FeatureDescription *)nnIf._80_8_)->name_;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation((MessageLite *)nnIf._80_8_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar4,"B",pAVar2);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)nnIf._80_8_);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l1);
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l1);
  pAVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar5);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar6);
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&pNVar5->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar5->name_,"if_relu",pAVar2);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"B");
  pNVar7 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(pNVar7,EXACT_ARRAY_MAPPING);
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers(pNVar7);
  pAVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar5);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar6);
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&pNVar5->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pNVar5->name_,"condition_producing_layer",pAVar2);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"cond");
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers(pNVar7);
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_branch(pNVar5);
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&pNVar5->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pNVar5->name_,"branch_layer",pAVar2);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"cond");
  pNVar7 = CoreML::Specification::BranchLayerParams::mutable_ifbranch
                     ((BranchLayerParams *)res.m_message.field_2._8_8_);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar7,(NeuralNetwork *)&l1);
  CoreML::validate<(MLModelType)500>((Result *)local_160,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_160);
  if (m._oneof_case_[0]._0_1_) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x113f);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"!((res).good())");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_160);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l1);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidBranchOutputNotProduced2() {
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    // "If" net
    Specification::NeuralNetwork nnIf;
    auto *l1 = nnIf.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("if_relu");
    l1->add_input("A");
    l1->add_output("B");

    // Main network
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    (void)l3->mutable_activation()->mutable_relu();
    l3->set_name("condition_producing_layer");
    l3->add_input("A");
    l3->add_output("cond");

    auto *l4 = nnMain->add_layers();
    auto *branch_layer = l4->mutable_branch();
    l4->set_name("branch_layer");
    l4->add_input("cond");
    branch_layer->mutable_ifbranch()->CopyFrom(nnIf);

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}